

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedatabase.cpp
# Opt level: O1

QMimeType __thiscall
QMimeDatabasePrivate::mimeTypeForFileNameAndData
          (QMimeDatabasePrivate *this,QString *fileName,QIODevice *device)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  long in_RCX;
  QMimeType *mime;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_f8;
  QArrayDataPointer<QString> QStack_e0;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined1 *puStack_c0;
  undefined1 *puStack_b8;
  undefined1 local_a8 [56];
  undefined1 *puStack_70;
  undefined1 *local_68;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  findByFileName((QMimeGlobMatchResult *)local_a8,(QMimeDatabasePrivate *)fileName,(QString *)device
                );
  if ((undefined1 *)local_a8._40_8_ == (undefined1 *)0x1) {
    (this->m_defaultMimeType).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    mimeTypeForName(this,fileName);
    bVar4 = QMimeType::isValid((QMimeType *)this);
    uVar3 = local_a8._16_8_;
    uVar2 = local_a8._8_8_;
    uVar1 = local_a8._0_8_;
    if (bVar4) goto LAB_004b1f31;
    QStack_e0.ptr = (QString *)0x0;
    QStack_e0.size = 0;
    QStack_e0.d = (Data *)0x0;
    local_c8 = 0;
    puStack_c0 = (undefined1 *)0x0;
    puStack_b8 = (undefined1 *)0x0;
    local_f8.d = (Data *)0x0;
    local_f8.ptr = (QString *)0x0;
    local_f8.size = 0;
    local_a8._0_8_ = (Data *)0x0;
    local_a8._8_8_ = (QString *)0x0;
    local_58.d = (Data *)uVar1;
    local_58.ptr = (QString *)uVar2;
    local_a8._16_8_ = (undefined1 *)0x0;
    local_58.size = uVar3;
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
    local_58.size = local_a8._40_8_;
    local_58.ptr = (QString *)local_a8._32_8_;
    local_58.d = (Data *)local_a8._24_8_;
    local_a8._40_8_ = QStack_e0.size;
    local_a8._32_8_ = QStack_e0.ptr;
    local_a8._24_8_ = QStack_e0.d;
    QStack_e0.d = (Data *)0x0;
    QStack_e0.ptr = (QString *)0x0;
    QStack_e0.size = 0;
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
    local_a8._48_8_ = CONCAT44(uStack_c4,local_c8);
    puStack_70 = puStack_c0;
    local_68 = puStack_b8;
    QArrayDataPointer<QString>::~QArrayDataPointer(&QStack_e0);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_f8);
    QMimeType::~QMimeType((QMimeType *)this);
  }
  local_f8.d = (Data *)fileName;
  local_f8.ptr = (QString *)local_a8;
  if (in_RCX == 0) {
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)&local_58,(QString *)device);
    mimeTypeForFileNameAndData::anon_class_16_2_b95a222d::operator()
              ((anon_class_16_2_b95a222d *)this,(QIODevice *)&local_f8);
    QFile::~QFile((QFile *)&local_58);
  }
  else {
    mimeTypeForFileNameAndData::anon_class_16_2_b95a222d::operator()
              ((anon_class_16_2_b95a222d *)this,(QIODevice *)&local_f8);
  }
LAB_004b1f31:
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)(local_a8 + 0x18));
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QExplicitlySharedDataPointer<QMimeTypePrivate>)
           (QExplicitlySharedDataPointer<QMimeTypePrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QMimeType QMimeDatabasePrivate::mimeTypeForFileNameAndData(const QString &fileName, QIODevice *device)
{
    // First, glob patterns are evaluated. If there is a match with max weight,
    // this one is selected and we are done. Otherwise, the file contents are
    // evaluated and the match with the highest value (either a magic priority or
    // a glob pattern weight) is selected. Matching starts from max level (most
    // specific) in both cases, even when there is already a suffix matching candidate.

    // Pass 1) Try to match on the file name
    QMimeGlobMatchResult candidatesByName = findByFileName(fileName);
    if (candidatesByName.m_allMatchingMimeTypes.size() == 1) {
        const QMimeType mime = mimeTypeForName(candidatesByName.m_matchingMimeTypes.at(0));
        if (mime.isValid())
            return mime;
        candidatesByName = {};
    }

    // Extension is unknown, or matches multiple mimetypes.
    // Pass 2) Match on content, if we can read the data
    const auto matchOnContent = [this, &candidatesByName](QIODevice *device) {
        const bool openedByUs = !device->isOpen() && device->open(QIODevice::ReadOnly);
        if (device->isOpen()) {
            // Read 16K in one go (QIODEVICE_BUFFERSIZE in qiodevice_p.h).
            // This is much faster than seeking back and forth into QIODevice.
            const QByteArray data = device->peek(16384);

            if (openedByUs)
                device->close();

            int magicAccuracy = 0;
            QMimeType candidateByData(findByData(data, &magicAccuracy));

            // Disambiguate conflicting extensions (if magic matching found something)
            if (candidateByData.isValid() && magicAccuracy > 0) {
                const QString sniffedMime = candidateByData.name();
                // If the sniffedMime matches a highest-weight glob match, use it
                if (candidatesByName.m_matchingMimeTypes.contains(sniffedMime)) {
                    return candidateByData;
                }
                for (const QString &m : std::as_const(candidatesByName.m_allMatchingMimeTypes)) {
                    if (inherits(m, sniffedMime)) {
                        // We have magic + pattern pointing to this, so it's a pretty good match
                        return mimeTypeForName(m);
                    }
                }
                if (candidatesByName.m_allMatchingMimeTypes.isEmpty()) {
                    // No glob, use magic
                    return candidateByData;
                }
            }
        }

        if (candidatesByName.m_allMatchingMimeTypes.size() > 1) {
            candidatesByName.m_matchingMimeTypes.sort(); // make it deterministic
            const QMimeType mime = mimeTypeForName(candidatesByName.m_matchingMimeTypes.at(0));
            if (mime.isValid())
                return mime;
        }

        return mimeTypeForName(defaultMimeType());
    };

    if (device)
        return matchOnContent(device);

    QFile fallbackFile(fileName);
    return matchOnContent(&fallbackFile);
}